

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::BuildNode::configureAttribute
          (BuildNode *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  ulong uVar1;
  undefined1 uVar2;
  StringRef name_local;
  StringRef value_local;
  Twine local_d8;
  Twine local_c0;
  Twine local_a8 [5];
  
  name_local.Length = name.Length;
  name_local.Data = name.Data;
  uVar1 = name_local.Length - 4 >> 1;
  if ((uVar1 | (ulong)((name_local.Length - 4 & 1) != 0) << 0x3f) < 0xc) {
    uVar2 = (*(code *)(&DAT_001ac9a4 + *(int *)(&DAT_001ac9a4 + uVar1 * 4)))();
    return (bool)uVar2;
  }
  llvm::Twine::Twine(local_a8,"unexpected attribute: \'",&name_local);
  llvm::Twine::Twine(&local_c0,"\'");
  llvm::Twine::concat(&local_d8,local_a8,&local_c0);
  ConfigureContext::error(ctx,&local_d8);
  return false;
}

Assistant:

bool BuildNode::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                   StringRef value) {
  if (name == "type") {
    if (value == "plain") {
      type = NodeType::Plain;
    } else if (value == "directory") {
      type = NodeType::Plain;
    } else if (value == "directory-structure") {
      type = NodeType::DirectoryStructure;
    } else if (value == "virtual") {
      type = NodeType::Virtual;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-directory") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::Directory;
    } else if (value == "false") {
      if (type == NodeType::Directory)
        type = NodeType::Plain;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-directory-structure") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::DirectoryStructure;
    } else if (value == "false") {
      if (type == NodeType::DirectoryStructure)
        type = NodeType::Plain;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-virtual") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::Virtual;
    } else if (value == "false") {
      if (type == NodeType::Virtual)
        type = NodeType::Plain;
      commandTimestamp = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-command-timestamp") {
    if (value == "true") {
      commandTimestamp = true;
      type = NodeType::Virtual;
    } else if (value == "false") {
      commandTimestamp = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-mutated") {
    if (value == "true") {
      mutated = true;
    } else if (value == "false") {
      mutated = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "content-exclusion-patterns") {
    exclusionPatterns = basic::StringList(value);
    return true;
  }
    
  // We don't support any other custom attributes.
  ctx.error("unexpected attribute: '" + name + "'");
  return false;
}